

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O3

void __thiscall sf::Shape::setTexture(Shape *this,Texture *texture,bool resetRect)

{
  undefined4 in_EAX;
  int iVar1;
  Vector2u VVar2;
  Vector2u VVar3;
  undefined1 auVar4 [16];
  
  if ((texture != (Texture *)0x0) &&
     ((resetRect ||
      ((this->m_texture == (Texture *)0x0 &&
       (auVar4._0_4_ = -(uint)((this->m_textureRect).left == 0),
       auVar4._4_4_ = -(uint)((this->m_textureRect).top == 0),
       auVar4._8_4_ = -(uint)((this->m_textureRect).width == 0),
       auVar4._12_4_ = -(uint)((this->m_textureRect).height == 0), iVar1 = movmskps(in_EAX,auVar4),
       iVar1 == 0xf)))))) {
    VVar2 = Texture::getSize(texture);
    VVar3 = Texture::getSize(texture);
    (this->m_textureRect).left = 0;
    (this->m_textureRect).top = 0;
    (this->m_textureRect).width = VVar2.x;
    (this->m_textureRect).height = VVar3.y;
    updateTexCoords(this);
  }
  this->m_texture = texture;
  return;
}

Assistant:

void Shape::setTexture(const Texture* texture, bool resetRect)
{
    if (texture)
    {
        // Recompute the texture area if requested, or if there was no texture & rect before
        if (resetRect || (!m_texture && (m_textureRect == IntRect())))
            setTextureRect(IntRect(0, 0, static_cast<int>(texture->getSize().x), static_cast<int>(texture->getSize().y)));
    }

    // Assign the new texture
    m_texture = texture;
}